

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode gzip_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  long lVar1;
  gzip_status gVar2;
  CURLcode CVar3;
  Curl_cwriter *pCVar4;
  uint uVar5;
  int iVar6;
  zlibInitState zStack_50;
  ssize_t hlen;
  Curl_cwriter *local_38;
  
  if (((byte)type & nbytes != 0) == 0) {
    CVar3 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
    return CVar3;
  }
  iVar6 = (int)nbytes;
  if (*(int *)&writer[1].cwt - 1U < 6) {
    switch(*(int *)&writer[1].cwt) {
    case 1:
      gVar2 = check_gzip_header((uchar *)buf,nbytes,&hlen);
      lVar1 = hlen;
      if (gVar2 != GZIP_OK) {
        if (gVar2 != GZIP_UNDERFLOW) {
LAB_0011c4cb:
          process_zlib_error(data,(z_stream *)&writer[1].next);
          CVar3 = CURLE_BAD_CONTENT_ENCODING;
          goto LAB_0011c513;
        }
        *(int *)&writer[1].ctx = iVar6;
        pCVar4 = (Curl_cwriter *)(*Curl_cmalloc)(nbytes & 0xffffffff);
        writer[1].next = pCVar4;
        if (pCVar4 != (Curl_cwriter *)0x0) {
          memcpy(pCVar4,buf,(ulong)*(uint *)&writer[1].ctx);
          *(undefined4 *)&writer[1].cwt = 4;
          return CURLE_OK;
        }
LAB_0011c511:
        CVar3 = CURLE_OUT_OF_MEMORY;
LAB_0011c513:
        CVar3 = exit_zlib(data,(z_stream *)&writer[1].next,(zlibInitState *)(writer + 1),CVar3);
        return CVar3;
      }
      break;
    default:
      goto switchD_0011c3e4_caseD_2;
    case 3:
      writer[1].next = (Curl_cwriter *)buf;
      *(int *)&writer[1].ctx = iVar6;
      CVar3 = process_trailer(data,(zlib_writer *)writer);
      return CVar3;
    case 4:
      uVar5 = *(int *)&writer[1].ctx + iVar6;
      *(uint *)&writer[1].ctx = uVar5;
      pCVar4 = (Curl_cwriter *)Curl_saferealloc(writer[1].next,(ulong)uVar5);
      writer[1].next = pCVar4;
      if (pCVar4 == (Curl_cwriter *)0x0) goto LAB_0011c511;
      memcpy((void *)((long)pCVar4 + (*(uint *)&writer[1].ctx - nbytes)),buf,nbytes);
      local_38 = writer[1].next;
      gVar2 = check_gzip_header((uchar *)local_38,(ulong)*(uint *)&writer[1].ctx,&hlen);
      if (gVar2 != GZIP_OK) {
        if (gVar2 == GZIP_UNDERFLOW) {
          return CURLE_OK;
        }
        goto LAB_0011c4cb;
      }
      (*Curl_cfree)(local_38);
      lVar1 = hlen + nbytes;
      nbytes = (size_t)*(uint *)&writer[1].ctx;
      lVar1 = lVar1 - nbytes;
      break;
    case 6:
      writer[1].next = (Curl_cwriter *)buf;
      *(int *)&writer[1].ctx = iVar6;
      zStack_50 = ZLIB_INIT_GZIP;
      goto LAB_0011c569;
    }
    writer[1].next = (Curl_cwriter *)(buf + lVar1);
    uVar5 = (int)nbytes - (int)hlen;
    nbytes = (size_t)uVar5;
    *(uint *)&writer[1].ctx = uVar5;
    *(undefined4 *)&writer[1].cwt = 5;
  }
  else {
switchD_0011c3e4_caseD_2:
    writer[1].next = (Curl_cwriter *)buf;
    *(int *)&writer[1].ctx = iVar6;
  }
  if ((int)nbytes == 0) {
    return CURLE_OK;
  }
  zStack_50 = ZLIB_GZIP_INFLATING;
LAB_0011c569:
  CVar3 = inflate_stream(data,writer,type,zStack_50);
  return CVar3;
}

Assistant:

static CURLcode gzip_do_write(struct Curl_easy *data,
                                    struct Curl_cwriter *writer, int type,
                                    const char *buf, size_t nbytes)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!(type & CLIENTWRITE_BODY) || !nbytes)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  if(zp->zlib_init == ZLIB_INIT_GZIP) {
    /* Let zlib handle the gzip decompression entirely */
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    /* Now uncompress the data */
    return inflate_stream(data, writer, type, ZLIB_INIT_GZIP);
  }

#ifndef OLD_ZLIB_SUPPORT
  /* Support for old zlib versions is compiled away and we are running with
     an old version, so return an error. */
  return exit_zlib(data, z, &zp->zlib_init, CURLE_WRITE_ERROR);

#else
  /* This next mess is to get around the potential case where there is not
   * enough data passed in to skip over the gzip header. If that happens, we
   * malloc a block and copy what we have then wait for the next call. If
   * there still is not enough (this is definitely a worst-case scenario), we
   * make the block bigger, copy the next part in and keep waiting.
   *
   * This is only required with zlib versions < 1.2.0.4 as newer versions
   * can handle the gzip header themselves.
   */

  switch(zp->zlib_init) {
  /* Skip over gzip header? */
  case ZLIB_INIT:
  {
    /* Initial call state */
    ssize_t hlen;

    switch(check_gzip_header((unsigned char *) buf, nbytes, &hlen)) {
    case GZIP_OK:
      z->next_in = (Bytef *) buf + hlen;
      z->avail_in = (uInt) (nbytes - hlen);
      zp->zlib_init = ZLIB_GZIP_INFLATING; /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We need more data so we can find the end of the gzip header. it is
       * possible that the memory block we malloc here will never be freed if
       * the transfer abruptly aborts after this point. Since it is unlikely
       * that circumstances will be right for this code path to be followed in
       * the first place, and it is even more unlikely for a transfer to fail
       * immediately afterwards, it should seldom be a problem.
       */
      z->avail_in = (uInt) nbytes;
      z->next_in = malloc(z->avail_in);
      if(!z->next_in) {
        return exit_zlib(data, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);
      }
      memcpy(z->next_in, buf, z->avail_in);
      zp->zlib_init = ZLIB_GZIP_HEADER;  /* Need more gzip header data state */
      /* We do not have any data to inflate yet */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
    }

  }
  break;

  case ZLIB_GZIP_HEADER:
  {
    /* Need more gzip header data state */
    ssize_t hlen;
    z->avail_in += (uInt) nbytes;
    z->next_in = Curl_saferealloc(z->next_in, z->avail_in);
    if(!z->next_in) {
      return exit_zlib(data, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);
    }
    /* Append the new block of data to the previous one */
    memcpy(z->next_in + z->avail_in - nbytes, buf, nbytes);

    switch(check_gzip_header(z->next_in, (ssize_t)z->avail_in, &hlen)) {
    case GZIP_OK:
      /* This is the zlib stream data */
      free(z->next_in);
      /* Do not point into the malloced block since we just freed it */
      z->next_in = (Bytef *) buf + hlen + nbytes - z->avail_in;
      z->avail_in = z->avail_in - (uInt)hlen;
      zp->zlib_init = ZLIB_GZIP_INFLATING;   /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We still do not have any data to inflate! */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
    }

  }
  break;

  case ZLIB_EXTERNAL_TRAILER:
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    return process_trailer(data, zp);

  case ZLIB_GZIP_INFLATING:
  default:
    /* Inflating stream state */
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    break;
  }

  if(z->avail_in == 0) {
    /* We do not have any data to inflate; wait until next time */
    return CURLE_OK;
  }

  /* We have parsed the header, now uncompress the data */
  return inflate_stream(data, writer, type, ZLIB_GZIP_INFLATING);
#endif
}